

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_belme_gfe
          (REF_DBL *metric,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  size_t __size;
  double dVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  REF_DBL *scalar;
  REF_DBL *grad;
  REF_DBL *scalar_00;
  REF_DBL *hessian;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  int iVar9;
  REF_STATUS RVar10;
  ulong uVar11;
  ulong uVar12;
  REF_DBL *pRVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  REF_DBL state [5];
  REF_DBL node_flux [5];
  REF_DBL *local_d8;
  long local_d0;
  REF_DBL *local_c8;
  REF_DBL local_a8 [4];
  REF_DBL local_88;
  REF_DBL RStack_80;
  REF_DBL local_78;
  REF_DBL RStack_70;
  REF_DBL local_68;
  REF_DBL local_58 [5];
  
  pRVar2 = ref_grid->node;
  uVar6 = pRVar2->max;
  uVar11 = (ulong)uVar6;
  if ((int)uVar6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xa87,
           "ref_metric_belme_gfe","malloc lam of REF_DBL negative");
    RVar10 = 1;
  }
  else {
    __size = uVar11 * 8;
    scalar = (REF_DBL *)malloc(__size);
    if (scalar == (REF_DBL *)0x0) {
      pcVar14 = "malloc lam of REF_DBL NULL";
      uVar8 = 0xa87;
    }
    else {
      if (uVar6 != 0) {
        memset(scalar,0,__size);
      }
      grad = (REF_DBL *)malloc(uVar11 * 0x18);
      if (grad == (REF_DBL *)0x0) {
        pcVar14 = "malloc grad_lam of REF_DBL NULL";
        uVar8 = 0xa88;
      }
      else {
        if (uVar6 == 0) {
          scalar_00 = (REF_DBL *)malloc(__size);
        }
        else {
          memset(grad,0,(uVar11 * 3 & 0xffffffff) << 3);
          scalar_00 = (REF_DBL *)calloc(1,__size);
        }
        if (scalar_00 == (REF_DBL *)0x0) {
          pcVar14 = "malloc flux of REF_DBL NULL";
          uVar8 = 0xa89;
        }
        else {
          hessian = (REF_DBL *)malloc(uVar11 * 0x30);
          if (hessian != (REF_DBL *)0x0) {
            if (uVar6 != 0) {
              memset(hessian,0,(uVar11 * 6 & 0xffffffff) << 3);
            }
            local_c8 = prim_dual + ldim / 2;
            local_d0 = 0;
            do {
              if (0 < (int)uVar11) {
                pRVar3 = pRVar2->global;
                uVar12 = 0;
                pRVar7 = local_c8;
                do {
                  if (-1 < pRVar3[uVar12]) {
                    scalar[uVar12] = *pRVar7;
                  }
                  uVar12 = uVar12 + 1;
                  pRVar7 = pRVar7 + ldim;
                } while ((uVar11 & 0xffffffff) != uVar12);
              }
              uVar6 = ref_recon_gradient(ref_grid,scalar,grad,reconstruction);
              if (uVar6 != 0) {
                pcVar14 = "grad_lam";
                uVar8 = 0xa93;
                goto LAB_001b4560;
              }
              uVar11 = (ulong)(uint)pRVar2->max;
              lVar16 = 0;
              do {
                if (0 < (int)uVar11) {
                  iVar9 = 0;
                  lVar15 = 0;
                  do {
                    if (-1 < pRVar2->global[lVar15]) {
                      local_a8[0] = 0.0;
                      local_a8[1] = 0.0;
                      local_a8[2] = 0.0;
                      local_a8[lVar16] = 1.0;
                      local_88 = prim_dual[iVar9];
                      RStack_80 = (prim_dual + iVar9)[1];
                      local_78 = prim_dual[(long)iVar9 + 2];
                      RStack_70 = (prim_dual + (long)iVar9 + 2)[1];
                      local_68 = prim_dual[(long)iVar9 + 4];
                      uVar6 = ref_phys_euler(&local_88,local_a8,local_58);
                      if (uVar6 != 0) {
                        pcVar14 = "euler";
                        uVar8 = 0xa9d;
                        goto LAB_001b4560;
                      }
                      scalar_00[lVar15] = local_58[local_d0];
                      uVar11 = (ulong)(uint)pRVar2->max;
                    }
                    lVar15 = lVar15 + 1;
                    iVar9 = iVar9 + ldim;
                  } while (lVar15 < (int)uVar11);
                }
                uVar6 = ref_recon_hessian(ref_grid,scalar_00,hessian,reconstruction);
                if (uVar6 != 0) {
                  pcVar14 = "hess";
                  uVar8 = 0xaa0;
                  goto LAB_001b4560;
                }
                iVar9 = pRVar2->max;
                uVar11 = (ulong)iVar9;
                if (0 < (long)uVar11) {
                  pRVar3 = pRVar2->global;
                  uVar12 = 0;
                  pRVar7 = hessian;
                  pRVar13 = metric;
                  do {
                    if (-1 < pRVar3[uVar12]) {
                      dVar1 = grad[lVar16 + uVar12 * 3];
                      if (dVar1 <= -dVar1) {
                        dVar1 = -dVar1;
                      }
                      lVar15 = 0;
                      do {
                        dVar4 = (pRVar7 + lVar15)[1];
                        dVar5 = (pRVar13 + lVar15)[1];
                        pRVar13[lVar15] = pRVar13[lVar15] + pRVar7[lVar15] * dVar1;
                        (pRVar13 + lVar15)[1] = dVar5 + dVar4 * dVar1;
                        lVar15 = lVar15 + 2;
                      } while (lVar15 != 6);
                    }
                    uVar12 = uVar12 + 1;
                    pRVar13 = pRVar13 + 6;
                    pRVar7 = pRVar7 + 6;
                  } while (uVar12 != uVar11);
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_d0 = local_d0 + 1;
              local_c8 = local_c8 + 1;
            } while (local_d0 != 5);
            if (0 < iVar9) {
              lVar16 = 0;
              local_d8 = metric;
              do {
                if (-1 < pRVar2->global[lVar16]) {
                  uVar6 = ref_matrix_healthy_m(local_d8);
                  if (uVar6 != 0) {
                    pcVar14 = "euler-opt-goal";
                    uVar8 = 0xaab;
LAB_001b4560:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,uVar8,"ref_metric_belme_gfe",(ulong)uVar6,pcVar14);
                    return uVar6;
                  }
                  uVar11 = (ulong)(uint)pRVar2->max;
                }
                lVar16 = lVar16 + 1;
                local_d8 = local_d8 + 6;
              } while (lVar16 < (int)uVar11);
            }
            free(hessian);
            free(scalar_00);
            free(grad);
            free(scalar);
            return 0;
          }
          pcVar14 = "malloc hess_flux of REF_DBL NULL";
          uVar8 = 0xa8a;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
           "ref_metric_belme_gfe",pcVar14);
    RVar10 = 2;
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_metric_belme_gfe(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, dir, node, i;
  REF_INT nequ;
  REF_DBL state[5], node_flux[5], direction[3];
  REF_DBL *lam, *grad_lam, *flux, *hess_flux;
  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(flux, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_flux, 6 * ref_node_max(ref_node), REF_DBL, 0.0);

  nequ = ldim / 2;

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");
    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        direction[0] = 0.0;
        direction[1] = 0.0;
        direction[2] = 0.0;
        direction[dir] = 1.0;
        for (i = 0; i < 5; i++) {
          state[i] = prim_dual[i + 0 * nequ + ldim * node];
        }
        RSS(ref_phys_euler(state, direction, node_flux), "euler");
        flux[node] = node_flux[var];
      }
      RSS(ref_recon_hessian(ref_grid, flux, hess_flux, reconstruction), "hess");
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 6; i++) {
          metric[i + 6 * node] +=
              ABS(grad_lam[dir + 3 * node]) * hess_flux[i + 6 * node];
        }
      }
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "euler-opt-goal");
  }

  ref_free(hess_flux);
  ref_free(flux);
  ref_free(grad_lam);
  ref_free(lam);

  return REF_SUCCESS;
}